

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Population *p)

{
  TypeName TVar1;
  ParamType PVar2;
  int32_t iVar3;
  ostream *poVar4;
  string *psVar5;
  string local_b8 [8];
  string pType;
  string pCov;
  string pVel;
  string pSafe;
  string pSize;
  Population *p_local;
  ostream *os_local;
  
  std::__cxx11::string::string((string *)(pSafe.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(pVel.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(pCov.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(pType.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_b8);
  TVar1 = Population::GetType(p);
  if (TVar1 == HERBIVORE) {
    std::__cxx11::string::operator=(local_b8,"HERBIVORE");
  }
  else if (TVar1 == CARNIVORE) {
    std::__cxx11::string::operator=(local_b8,"CARNIVORE");
  }
  PVar2 = Population::GetSize(p);
  switch(PVar2) {
  case VERY_SMALL:
    std::__cxx11::string::operator=((string *)(pSafe.field_2._M_local_buf + 8),"VERY_SMALL");
    break;
  case SMALL:
    std::__cxx11::string::operator=((string *)(pSafe.field_2._M_local_buf + 8),"SMALL");
    break;
  case AVERAGE:
    std::__cxx11::string::operator=((string *)(pSafe.field_2._M_local_buf + 8),"AVERAGE");
    break;
  case BIG:
    std::__cxx11::string::operator=((string *)(pSafe.field_2._M_local_buf + 8),"BIG");
    break;
  case VERY_BIG:
    std::__cxx11::string::operator=((string *)(pSafe.field_2._M_local_buf + 8),"VERY_BIG");
  }
  PVar2 = Population::GetSafety(p);
  switch(PVar2) {
  case VERY_SMALL:
    std::__cxx11::string::operator=((string *)(pVel.field_2._M_local_buf + 8),"VERY_SMALL");
    break;
  case SMALL:
    std::__cxx11::string::operator=((string *)(pVel.field_2._M_local_buf + 8),"SMALL");
    break;
  case AVERAGE:
    std::__cxx11::string::operator=((string *)(pVel.field_2._M_local_buf + 8),"AVERAGE");
    break;
  case BIG:
    std::__cxx11::string::operator=((string *)(pVel.field_2._M_local_buf + 8),"BIG");
    break;
  case VERY_BIG:
    std::__cxx11::string::operator=((string *)(pVel.field_2._M_local_buf + 8),"VERY_BIG");
  }
  PVar2 = Population::GetVelocity(p);
  switch(PVar2) {
  case VERY_SMALL:
    std::__cxx11::string::operator=((string *)(pCov.field_2._M_local_buf + 8),"VERY_SMALL");
    break;
  case SMALL:
    std::__cxx11::string::operator=((string *)(pCov.field_2._M_local_buf + 8),"SMALL");
    break;
  case AVERAGE:
    std::__cxx11::string::operator=((string *)(pCov.field_2._M_local_buf + 8),"AVERAGE");
    break;
  case BIG:
    std::__cxx11::string::operator=((string *)(pCov.field_2._M_local_buf + 8),"BIG");
    break;
  case VERY_BIG:
    std::__cxx11::string::operator=((string *)(pCov.field_2._M_local_buf + 8),"VERY_BIG");
  }
  PVar2 = Population::GetCover(p);
  switch(PVar2) {
  case VERY_SMALL:
    std::__cxx11::string::operator=((string *)(pType.field_2._M_local_buf + 8),"VERY_SMALL");
    break;
  case SMALL:
    std::__cxx11::string::operator=((string *)(pType.field_2._M_local_buf + 8),"SMALL");
    break;
  case AVERAGE:
    std::__cxx11::string::operator=((string *)(pType.field_2._M_local_buf + 8),"AVERAGE");
    break;
  case BIG:
    std::__cxx11::string::operator=((string *)(pType.field_2._M_local_buf + 8),"BIG");
    break;
  case VERY_BIG:
    std::__cxx11::string::operator=((string *)(pType.field_2._M_local_buf + 8),"VERY_BIG");
  }
  poVar4 = std::operator<<(os,local_b8);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,(string *)(pSafe.field_2._M_local_buf + 8));
  poVar4 = std::operator<<(poVar4," ");
  psVar5 = Population::GetName_abi_cxx11_(p);
  poVar4 = std::operator<<(poVar4,(string *)psVar5);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"animalAmount ");
  iVar3 = Population::GetAnimalAmount(p);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"health       ");
  iVar3 = Population::GetHealth(p);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"productivity ");
  iVar3 = Population::GetProductivity(p);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"biologyDev   ");
  iVar3 = Population::GetBiologyDev(p);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"safety       ");
  poVar4 = std::operator<<(poVar4,(string *)(pVel.field_2._M_local_buf + 8));
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"velocity     ");
  poVar4 = std::operator<<(poVar4,(string *)(pCov.field_2._M_local_buf + 8));
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"cover        ");
  poVar4 = std::operator<<(poVar4,(string *)(pType.field_2._M_local_buf + 8));
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"xPos         ");
  iVar3 = Population::GetXPos(p);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"yPos         ");
  iVar3 = Population::GetYPos(p);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(os,"MUTATIONS");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  CompoundMutation::getMutation(&p->mutationTree);
  CompoundMutation::print(&p->mutationTree,os);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)(pType.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(pCov.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(pVel.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(pSafe.field_2._M_local_buf + 8));
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, Population &p) {
  std::string pSize, pSafe, pVel, pCov, pType;
  switch (p.GetType()) {
    case Population::HERBIVORE:pType = "HERBIVORE";
      break;
    case Population::CARNIVORE:pType = "CARNIVORE";
      break;
  }

  switch (p.GetSize()) {
    case Population::VERY_SMALL:pSize = "VERY_SMALL";
      break;
    case Population::SMALL:pSize = "SMALL";
      break;
    case Population::AVERAGE:pSize = "AVERAGE";
      break;
    case Population::BIG:pSize = "BIG";
      break;
    case Population::VERY_BIG:pSize = "VERY_BIG";
      break;
  }

  switch (p.GetSafety()) {
    case Population::VERY_SMALL:pSafe = "VERY_SMALL";
      break;
    case Population::SMALL:pSafe = "SMALL";
      break;
    case Population::AVERAGE:pSafe = "AVERAGE";
      break;
    case Population::BIG:pSafe = "BIG";
      break;
    case Population::VERY_BIG:pSafe = "VERY_BIG";
      break;
  }

  switch (p.GetVelocity()) {
    case Population::VERY_SMALL:pVel = "VERY_SMALL";
      break;
    case Population::SMALL:pVel = "SMALL";
      break;
    case Population::AVERAGE:pVel = "AVERAGE";
      break;
    case Population::BIG:pVel = "BIG";
      break;
    case Population::VERY_BIG:pVel = "VERY_BIG";
      break;
  }

  switch (p.GetCover()) {
    case Population::VERY_SMALL:pCov = "VERY_SMALL";
      break;
    case Population::SMALL:pCov = "SMALL";
      break;
    case Population::AVERAGE:pCov = "AVERAGE";
      break;
    case Population::BIG:pCov = "BIG";
      break;
    case Population::VERY_BIG:pCov = "VERY_BIG";
      break;
  }
  os << pType << " " << pSize << " " << p.GetName() << "\n"
     << "animalAmount " << p.GetAnimalAmount() << "\n"
     << "health       " << p.GetHealth() << "\n"
     << "productivity " << p.GetProductivity() << "\n"
     << "biologyDev   " << p.GetBiologyDev() << "\n"
     << "safety       " << pSafe << "\n"
     << "velocity     " << pVel << "\n"
     << "cover        " << pCov << "\n"
     << "xPos         " << p.GetXPos() << "\n"
     << "yPos         " << p.GetYPos() << "\n";
  os << "MUTATIONS" << std::endl;
  p.mutationTree.getMutation();
  p.mutationTree.print(os);
  return os;
}